

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

int uv__getpwuid_r(uv_passwd_t *pwd)

{
  __uid_t __uid;
  int iVar1;
  size_t sVar2;
  char *__buffer;
  size_t sVar3;
  size_t sVar4;
  char *__dest;
  passwd *result;
  passwd pw;
  passwd *local_68;
  passwd local_60;
  
  if (pwd == (uv_passwd_t *)0x0) {
    return -0x16;
  }
  sVar2 = sysconf(0x46);
  sVar3 = 0x1000;
  if (0 < (long)sVar2) {
    sVar3 = sVar2;
  }
  __uid = geteuid();
  uv__free((void *)0x0);
  __buffer = (char *)uv__malloc(sVar3);
  if (__buffer != (char *)0x0) {
    do {
      iVar1 = getpwuid_r(__uid,&local_60,__buffer,sVar3,&local_68);
      if (iVar1 != 0x22) {
        if (iVar1 != 0) {
          uv__free(__buffer);
          return -iVar1;
        }
        if (local_68 != (passwd *)0x0) {
          sVar3 = strlen(local_60.pw_name);
          sVar2 = strlen(local_60.pw_dir);
          sVar4 = strlen(local_60.pw_shell);
          __dest = (char *)uv__malloc(sVar2 + sVar3 + sVar4 + 3);
          pwd->username = __dest;
          if (__dest == (char *)0x0) {
            uv__free(__buffer);
            return -0xc;
          }
          memcpy(__dest,local_60.pw_name,sVar3 + 1);
          pwd->homedir = pwd->username + sVar3 + 1;
          memcpy(pwd->username + sVar3 + 1,local_60.pw_dir,sVar2 + 1);
          pwd->shell = pwd->homedir + sVar2 + 1;
          memcpy(pwd->homedir + sVar2 + 1,local_60.pw_shell,sVar4 + 1);
          pwd->uid = (ulong)local_60.pw_uid;
          pwd->gid = (ulong)local_60.pw_gid;
          uv__free(__buffer);
          return 0;
        }
        uv__free(__buffer);
        return -2;
      }
      sVar3 = sVar3 * 2;
      uv__free(__buffer);
      __buffer = (char *)uv__malloc(sVar3);
    } while (__buffer != (char *)0x0);
  }
  return -0xc;
}

Assistant:

int uv__getpwuid_r(uv_passwd_t* pwd) {
  struct passwd pw;
  struct passwd* result;
  char* buf;
  uid_t uid;
  size_t bufsize;
  size_t name_size;
  size_t homedir_size;
  size_t shell_size;
  long initsize;
  int r;
#if defined(__ANDROID_API__) && __ANDROID_API__ < 21
  int (*getpwuid_r)(uid_t, struct passwd*, char*, size_t, struct passwd**);

  getpwuid_r = dlsym(RTLD_DEFAULT, "getpwuid_r");
  if (getpwuid_r == NULL)
    return -ENOSYS;
#endif

  if (pwd == NULL)
    return -EINVAL;

  initsize = sysconf(_SC_GETPW_R_SIZE_MAX);

  if (initsize <= 0)
    bufsize = 4096;
  else
    bufsize = (size_t) initsize;

  uid = geteuid();
  buf = NULL;

  for (;;) {
    uv__free(buf);
    buf = uv__malloc(bufsize);

    if (buf == NULL)
      return -ENOMEM;

    r = getpwuid_r(uid, &pw, buf, bufsize, &result);

    if (r != ERANGE)
      break;

    bufsize *= 2;
  }

  if (r != 0) {
    uv__free(buf);
    return -r;
  }

  if (result == NULL) {
    uv__free(buf);
    return -ENOENT;
  }

  /* Allocate memory for the username, shell, and home directory */
  name_size = strlen(pw.pw_name) + 1;
  homedir_size = strlen(pw.pw_dir) + 1;
  shell_size = strlen(pw.pw_shell) + 1;
  pwd->username = uv__malloc(name_size + homedir_size + shell_size);

  if (pwd->username == NULL) {
    uv__free(buf);
    return -ENOMEM;
  }

  /* Copy the username */
  memcpy(pwd->username, pw.pw_name, name_size);

  /* Copy the home directory */
  pwd->homedir = pwd->username + name_size;
  memcpy(pwd->homedir, pw.pw_dir, homedir_size);

  /* Copy the shell */
  pwd->shell = pwd->homedir + homedir_size;
  memcpy(pwd->shell, pw.pw_shell, shell_size);

  /* Copy the uid and gid */
  pwd->uid = pw.pw_uid;
  pwd->gid = pw.pw_gid;

  uv__free(buf);

  return 0;
}